

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

void __thiscall QPDF::createFromJSON(QPDF *this,string *json_file)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined1 local_41;
  FileInputSource *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  pointer local_30;
  shared_ptr<InputSource> local_28;
  
  local_30 = (json_file->_M_dataplus)._M_p;
  local_40 = (FileInputSource *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<FileInputSource,std::allocator<FileInputSource>,char_const*>
            (&_Stack_38,&local_40,(allocator<FileInputSource> *)&local_41,&local_30);
  this_00._M_pi = _Stack_38._M_pi;
  local_28.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_40->super_InputSource;
  local_28.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_38._M_pi;
  local_40 = (FileInputSource *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  createFromJSON(this,&local_28);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  return;
}

Assistant:

void
QPDF::createFromJSON(std::string const& json_file)
{
    createFromJSON(std::make_shared<FileInputSource>(json_file.c_str()));
}